

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O3

void __thiscall
embree::ParallelRadixSort<embree::parallel_map<unsigned_long,_float>::KeyValue,_unsigned_long>::
tbbRadixIteration1(ParallelRadixSort<embree::parallel_map<unsigned_long,_float>::KeyValue,_unsigned_long>
                   *this,unsigned_long shift,KeyValue *src,KeyValue *dst,size_t threadIndex,
                  size_t threadCount)

{
  uint *puVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  size_t i;
  ulong uVar5;
  uint uVar6;
  TyRadixCount *pauVar7;
  size_t sVar8;
  ulong uVar9;
  TyRadixCount *pauVar10;
  long lVar11;
  uint offset [256];
  uint total [256];
  uint local_880 [256];
  uint local_480 [276];
  
  sVar2 = this->N;
  lVar11 = 0;
  memset(local_880 + 0x100,0,0x400);
  uVar5 = (sVar2 * threadIndex) / threadCount;
  pauVar10 = this->radixCount;
  pauVar7 = pauVar10;
  do {
    uVar9 = 0xfffffffffffffffc;
    do {
      puVar1 = *pauVar7 + uVar9 + 4;
      uVar6 = puVar1[1];
      uVar3 = puVar1[2];
      uVar4 = puVar1[3];
      local_880[uVar9 + 0x104] = *puVar1 + local_880[uVar9 + 0x104];
      local_880[uVar9 + 0x105] = uVar6 + local_880[uVar9 + 0x105];
      local_880[uVar9 + 0x106] = uVar3 + local_880[uVar9 + 0x106];
      local_880[uVar9 + 0x107] = uVar4 + local_880[uVar9 + 0x107];
      uVar9 = uVar9 + 4;
    } while (uVar9 < 0xfc);
    lVar11 = lVar11 + 1;
    pauVar7 = pauVar7 + 1;
  } while (lVar11 != threadCount + (threadCount == 0));
  local_880[0] = 0;
  lVar11 = 1;
  uVar6 = 0;
  do {
    uVar6 = uVar6 + local_880[lVar11 + 0xff];
    local_880[lVar11] = uVar6;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x100);
  if (threadIndex != 0) {
    sVar8 = 0;
    do {
      uVar9 = 0xfffffffffffffffc;
      do {
        puVar1 = *pauVar10 + uVar9 + 4;
        uVar6 = puVar1[1];
        uVar3 = puVar1[2];
        uVar4 = puVar1[3];
        local_880[uVar9 + 4] = *puVar1 + local_880[uVar9 + 4];
        local_880[uVar9 + 5] = uVar6 + local_880[uVar9 + 5];
        local_880[uVar9 + 6] = uVar3 + local_880[uVar9 + 6];
        local_880[uVar9 + 7] = uVar4 + local_880[uVar9 + 7];
        uVar9 = uVar9 + 4;
      } while (uVar9 < 0xfc);
      sVar8 = sVar8 + 1;
      pauVar10 = pauVar10 + 1;
    } while (sVar8 != threadIndex);
  }
  for (; uVar5 < ((threadIndex + 1) * sVar2) / threadCount; uVar5 = uVar5 + 1) {
    uVar9 = src[uVar5].key >> ((byte)shift & 0x3f) & 0xff;
    uVar6 = local_880[uVar9];
    local_880[uVar9] = uVar6 + 1;
    dst[uVar6].val = src[uVar5].val;
    dst[uVar6].key = src[uVar5].key;
  }
  return;
}

Assistant:

void tbbRadixIteration1(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* calculate total number of items for each bucket */
      __aligned(64) unsigned int total[BUCKETS];
      /*
      for (size_t i=0; i<BUCKETS; i++)
        total[i] = 0;
      */
      for (size_t i=0; i<BUCKETS; i+=VSIZEX)
        vintx::store(&total[i], zero);
      
      for (size_t i=0; i<threadCount; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          total[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&total[j], vintx::load(&total[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* calculate start offset of each bucket */
      __aligned(64) unsigned int offset[BUCKETS];
      offset[0] = 0;
      for (size_t i=1; i<BUCKETS; i++)    
        offset[i] = offset[i-1] + total[i-1];
      
      /* calculate start offset of each bucket for this thread */
      for (size_t i=0; i<threadIndex; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          offset[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&offset[j], vintx::load(&offset[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* copy items into their buckets */
#if defined(__INTEL_COMPILER)
#pragma nounroll
#endif
      for (size_t i=startID; i<endID; i++) {
        const Ty elt = src[i];
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const size_t index = ((Key)src[i] >> shift) & mask;
#endif
        dst[offset[index]++] = elt;
      }
    }